

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPredictorTIFFSubStream.cpp
# Opt level: O3

void __thiscall InputPredictorTIFFSubStream::DecodeBufferToColors(InputPredictorTIFFSubStream *this)

{
  byte bVar1;
  Byte *pBVar2;
  unsigned_short *puVar3;
  Byte j;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  bVar1 = this->mBitsPerComponent;
  uVar6 = (ulong)bVar1;
  if (bVar1 == 8) {
    uVar9 = this->mReadColorsCount;
    if (uVar9 != 0) {
      pBVar2 = this->mRowBuffer;
      puVar3 = this->mReadColors;
      uVar6 = 0;
      do {
        puVar3[uVar6] = (ushort)pBVar2[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
      goto LAB_00206ac4;
    }
  }
  else {
    uVar9 = this->mReadColorsCount;
    if (bVar1 < 8) {
      if (7 < uVar9 * uVar6) {
        uVar8 = 0;
        do {
          if ((byte)uVar6 < 9) {
            uVar9 = 0;
            do {
              pBVar2 = this->mRowBuffer;
              this->mReadColors[(uVar8 * 8 + 8) / uVar6 + ~uVar9] =
                   (ushort)pBVar2[uVar8] & this->mBitMask;
              pBVar2[uVar8] = pBVar2[uVar8] >> ((byte)uVar6 & 0x1f);
              uVar9 = uVar9 + 1;
              uVar6 = (ulong)this->mBitsPerComponent;
            } while (uVar9 < (byte)(8 / this->mBitsPerComponent));
            uVar9 = this->mReadColorsCount;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar6 * uVar9 >> 3);
      }
    }
    else {
      if (uVar9 == 0) goto LAB_00206af5;
      pBVar2 = this->mRowBuffer;
      puVar3 = this->mReadColors;
      uVar8 = 0;
      uVar10 = 0;
      do {
        puVar3[uVar10] = 0;
        uVar4 = 0;
        uVar5 = 0;
        do {
          uVar5 = (uint)pBVar2[uVar4 + (uVar8 >> 3)] + ((uVar5 & 0xffff) << (bVar1 & 0x1f));
          puVar3[uVar10] = (unsigned_short)uVar5;
          uVar4 = uVar4 + 1;
        } while (bVar1 >> 3 != uVar4);
        uVar10 = uVar10 + 1;
        uVar8 = uVar8 + uVar6;
      } while (uVar10 != uVar9);
    }
LAB_00206ac4:
    uVar6 = this->mColors;
    if (uVar6 < uVar9) {
      puVar3 = this->mReadColors;
      lVar7 = 0;
      do {
        puVar3[uVar6 + lVar7] = puVar3[lVar7] + puVar3[uVar6 + lVar7] & this->mBitMask;
        lVar7 = lVar7 + 1;
      } while (uVar9 - uVar6 != lVar7);
      goto LAB_00206af9;
    }
  }
LAB_00206af5:
  puVar3 = this->mReadColors;
LAB_00206af9:
  this->mReadColorsIndex = puVar3;
  this->mIndexInColor = '\0';
  return;
}

Assistant:

void InputPredictorTIFFSubStream::DecodeBufferToColors()
{	
	//1. Split to colors. Use array of colors (should be columns * colors). Each time take BitsPerComponent of the buffer
	//2. Once you got the "colors", loop the array, setting values after diffs (use modulo of bit mask for "sign" computing)
	//3. Now you have the colors array. 
	LongBufferSizeType i = 0;

	// read the colors differences according to bits per component
	if(8 == mBitsPerComponent)
	{
		for(; i < mReadColorsCount;++i)
			mReadColors[i] = mRowBuffer[i];
	}
	else if(8 > mBitsPerComponent)
	{
		for(; i < (mReadColorsCount*mBitsPerComponent/8);++i)
		{
			for(LongBufferSizeType j=0; j < (LongBufferSizeType)(8/mBitsPerComponent); ++j)
			{
				mReadColors[(i+1)*8/mBitsPerComponent - j - 1] = mRowBuffer[i] & mBitMask;
				mRowBuffer[i] = mRowBuffer[i]>>mBitsPerComponent;
			}
		}
	}
	else // mBitesPerComponent > 8
	{
		for(; i < mReadColorsCount;++i)
		{
			mReadColors[i] = 0;
			for(Byte j=0;j<mBitsPerComponent/8;++j)
				mReadColors[i] = (mReadColors[i]<<mBitsPerComponent) + mRowBuffer[i*mBitsPerComponent/8 + j];
		}
	}

	// calculate color values according to diffs
	for(i = mColors; i < mReadColorsCount; ++i)
		mReadColors[i] = (mReadColors[i] + mReadColors[i-mColors]) & mBitMask;

	mReadColorsIndex = mReadColors;
	mIndexInColor = 0;

}